

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_field.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::price::PriceField::PriceField(PriceField *this,PriceField *to_copy)

{
  Type TVar1;
  string *psVar2;
  pointer pcVar3;
  string *psVar4;
  
  TVar1 = to_copy->type_;
  this->type_ = TVar1;
  switch(TVar1) {
  case INTEGER:
    (this->field_1).int_value_ = (to_copy->field_1).int_value_;
    break;
  case LONG:
    this->field_1 = to_copy->field_1;
    break;
  case DOUBLE:
    this->field_1 = to_copy->field_1;
    break;
  case STRING:
    psVar4 = (string *)operator_new(0x20);
    psVar2 = (to_copy->field_1).string_value_;
    (psVar4->_M_dataplus)._M_p = (pointer)&psVar4->field_2;
    pcVar3 = (psVar2->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)psVar4,pcVar3,pcVar3 + psVar2->_M_string_length);
    (this->field_1).string_value_ = psVar4;
  }
  return;
}

Assistant:

PriceField::PriceField(const PriceField &to_copy) : type_(to_copy.type_)
{
    switch(type_)
    {
        case INTEGER:
            int_value_ = to_copy.int_value_;
            break;
        case LONG:
            long_value_ = to_copy.long_value_;
            break;
        case DOUBLE:
            double_value_ = to_copy.double_value_;
            break;
        case STRING:
            string_value_ = new std::string(*to_copy.string_value_);
            break;
        case NOTHING:
            break;
    }
}